

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_loader.c
# Opt level: O1

plugin plugin_loader_load(plugin_loader_conflict l,char *name,void *impl,_func_void_plugin *dtor)

{
  size_t __n;
  size_t sVar1;
  char *library_name;
  char *symbol_iface_name;
  plugin_descriptor descriptor;
  void *iface;
  plugin ppVar2;
  size_t name_length;
  undefined8 uVar3;
  char *pcVar4;
  plugin_manager ppVar5;
  
  pcVar4 = l->library_suffix;
  __n = strlen(name);
  sVar1 = strlen(pcVar4);
  library_name = (char *)malloc(sVar1 + __n + 1);
  if (library_name == (char *)0x0) {
    library_name = (char *)0x0;
  }
  else {
    memcpy(library_name,name,__n);
    memcpy(library_name + __n,pcVar4,sVar1);
    library_name[sVar1 + __n] = '\0';
  }
  if (library_name == (char *)0x0) {
    ppVar5 = l->manager;
    pcVar4 = "Plugin loader from manager \'%s\' failed to allocate the library name for plugin: %s";
    uVar3 = 0xcc;
  }
  else {
    pcVar4 = l->symbol_iface_suffix;
    sVar1 = strlen(pcVar4);
    symbol_iface_name = (char *)malloc(sVar1 + __n + 1);
    if (symbol_iface_name == (char *)0x0) {
      symbol_iface_name = (char *)0x0;
    }
    else {
      memcpy(symbol_iface_name,name,__n);
      memcpy(symbol_iface_name + __n,pcVar4,sVar1);
      symbol_iface_name[sVar1 + __n] = '\0';
    }
    if (symbol_iface_name == (char *)0x0) {
      log_write_impl_va("metacall",0xd4,"plugin_loader_load",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                        ,3,
                        "Plugin loader from manager \'%s\' failed to allocate the symbol interface name for plugin: %s"
                        ,l->manager->name,name);
      free(library_name);
      return (plugin)0x0;
    }
    descriptor = plugin_descriptor_create(l->manager->library_path,library_name,symbol_iface_name);
    if (descriptor != (plugin_descriptor)0x0) {
      iface = (*descriptor->iface_singleton)();
      ppVar2 = plugin_create(name,descriptor,iface,impl,dtor);
      return ppVar2;
    }
    ppVar5 = l->manager;
    pcVar4 = "Plugin loader from manager \'%s\' failed to load plugin: %s";
    uVar3 = 0xdd;
  }
  log_write_impl_va("metacall",uVar3,"plugin_loader_load",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_loader.c"
                    ,3,pcVar4,ppVar5->name,name);
  return (plugin)0x0;
}

Assistant:

plugin plugin_loader_load(plugin_loader l, const char *name, void *impl, void (*dtor)(plugin))
{
	char *library_name = plugin_loader_generate_library_name(name, l->library_suffix);

	if (library_name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Plugin loader from manager '%s' failed to allocate the library name for plugin: %s", l->manager->name, name);
		return NULL;
	}

	char *symbol_iface_name = plugin_loader_generate_symbol_iface_name(name, l->symbol_iface_suffix);

	if (symbol_iface_name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Plugin loader from manager '%s' failed to allocate the symbol interface name for plugin: %s", l->manager->name, name);
		free(library_name);
		return NULL;
	}

	plugin_descriptor descriptor = plugin_descriptor_create(l->manager->library_path, library_name, symbol_iface_name);

	if (descriptor == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Plugin loader from manager '%s' failed to load plugin: %s", l->manager->name, name);
		return NULL;
	}

	return plugin_create(name, descriptor, descriptor->iface_singleton(), impl, dtor);
}